

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

void __thiscall Imf_3_2::anon_unknown_0::PtrIStream::seekg(PtrIStream *this,uint64_t pos)

{
  InputExc *this_00;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if ((-1 < (long)pos) && (this->base + pos <= this->end)) {
    this->current = this->base + pos;
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"Out of range seek requested\n",0x1c)
  ;
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(this_00,asStack_198);
  __cxa_throw(this_00,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

virtual void     seekg (uint64_t pos)
    {

        if (pos < 0)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "internal error: seek to " << pos << " requested");
        }

        const char* newcurrent = base + pos;

        if (newcurrent < base || newcurrent > end)
        {
            THROW (IEX_NAMESPACE::InputExc, "Out of range seek requested\n");
        }

        current = newcurrent;
    }